

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O0

int Sim_NtkSimTwoPats_rec(Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  uint local_20;
  uint local_1c;
  int Value1;
  int Value0;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    pAVar2 = Abc_ObjFanin0(pNode);
    local_1c = Sim_NtkSimTwoPats_rec(pAVar2);
    pAVar2 = Abc_ObjFanin1(pNode);
    local_20 = Sim_NtkSimTwoPats_rec(pAVar2);
    iVar1 = Abc_ObjFaninC0(pNode);
    if (iVar1 != 0) {
      local_1c = local_1c ^ 0xffffffff;
    }
    iVar1 = Abc_ObjFaninC1(pNode);
    if (iVar1 != 0) {
      local_20 = local_20 ^ 0xffffffff;
    }
    pNode->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)(int)(local_1c & local_20);
    pNode_local._4_4_ = local_1c & local_20;
  }
  else {
    pNode_local._4_4_ = (pNode->field_6).iTemp;
  }
  return pNode_local._4_4_;
}

Assistant:

int Sim_NtkSimTwoPats_rec( Abc_Obj_t * pNode )
{
    int Value0, Value1;
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return (int)(ABC_PTRUINT_T)pNode->pCopy;
    Abc_NodeSetTravIdCurrent( pNode );
    Value0 = Sim_NtkSimTwoPats_rec( Abc_ObjFanin0(pNode) );
    Value1 = Sim_NtkSimTwoPats_rec( Abc_ObjFanin1(pNode) );
    if ( Abc_ObjFaninC0(pNode) )
        Value0 = ~Value0;
    if ( Abc_ObjFaninC1(pNode) )
        Value1 = ~Value1;
    pNode->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)(Value0 & Value1);
    return Value0 & Value1;
}